

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O0

R * QtPrivate::invokeMethodHelper<>(QMetaMethodReturnArgument r)

{
  long lVar1;
  R *in_RDI;
  long in_FS_OFFSET;
  array<const_QtPrivate::QMetaTypeInterface_*,_1UL> types;
  array<const_char_*,_1UL> names;
  array<const_void_*,_1UL> params;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->parameters)._M_elems[0] = (void *)params._M_elems[0];
  (in_RDI->typeNames)._M_elems[0] = (char *)names._M_elems[0];
  (in_RDI->metaTypes)._M_elems[0] = (QMetaTypeInterface *)types._M_elems[0];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline auto invokeMethodHelper(QMetaMethodReturnArgument r, const Args &... arguments)
{
    std::array params = { const_cast<const void *>(r.data), Invoke::dataHelper(arguments)... };
    std::array names = { r.name, Invoke::typenameHelper(arguments)... };
    std::array types = { r.metaType, Invoke::metaTypeHelper(arguments)... };
    static_assert(params.size() == types.size());
    static_assert(params.size() == names.size());

    struct R {
        decltype(params) parameters;
        decltype(names) typeNames;
        decltype(types) metaTypes;
        constexpr qsizetype parameterCount() const { return qsizetype(parameters.size()); }
    };
    return R { params, names, types };
}